

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_1::checkColorAttachmentParam
               (TestContext *testCtx,CallLogWrapper *gl,GLenum target,GLenum pname,GLenum reference)

{
  GLenum reference_local;
  GLenum pname_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  checkAttachmentParam(testCtx,gl,target,0x8ce0,pname,reference);
  return;
}

Assistant:

void checkColorAttachmentParam(tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLenum target, GLenum pname, GLenum reference)
{
	checkAttachmentParam(testCtx, gl, target, GL_COLOR_ATTACHMENT0, pname, reference);
}